

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O1

void e2e_fdb_del_person(storage_t *st,person_t *p)

{
  int *piVar1;
  __atomic_base<unsigned_long> __s2;
  fdb_file_handle *pfVar2;
  bool bVar3;
  fdb_status fVar4;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  checkpoint_t *pcVar8;
  __atomic_base<unsigned_long> __s;
  fdb_seqnum_t fVar9;
  char *__s1;
  undefined4 uVar10;
  fdb_doc *pfVar11;
  checkpoint_t *handle_in;
  char *pcVar12;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_file_handle *fhandle;
  char *handle;
  snap_handle **unaff_R13;
  long lVar15;
  fdb_file_handle **ppfVar16;
  list *doc_00;
  fdb_doc *doc;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_408;
  uint64_t uStackY_400;
  fdb_kvs_handle **ppfStackY_3f8;
  fdb_kvs_handle *pfStackY_3f0;
  list *plStackY_3e8;
  fdb_file_handle **ppfStackY_3d8;
  fdb_file_handle *pfStackY_3d0;
  undefined8 uStackY_3c8;
  fdb_file_handle **ppfStackY_3c0;
  timeval tStackY_3b8;
  checkpoint_t *pcStackY_3a8;
  fdb_kvs_handle *pfStackY_3a0;
  snap_handle **ppsStackY_398;
  fdb_kvs_handle *pfStackY_390;
  list *plStackY_388;
  code *pcStackY_380;
  fdb_doc *pfStack_370;
  fdb_iterator *pfStack_368;
  fdb_kvs_handle *pfStack_360;
  idx_prams_t iStack_358;
  timeval tStack_340;
  fdb_kvs_handle *pfStack_330;
  fdb_kvs_handle *pfStack_328;
  checkpoint_t *pcStack_320;
  list *plStack_318;
  fdb_doc *pfStack_308;
  timeval tStack_300;
  undefined1 auStack_2f0 [48];
  char acStack_2c0 [264];
  fdb_kvs_handle *pfStack_1b8;
  checkpoint_t *pcStack_1b0;
  undefined1 auStack_1a0 [24];
  atomic<unsigned_long> aStack_188;
  fdb_kvs_handle *pfStack_180;
  atomic<unsigned_long> aStack_178;
  snap_handle *psStack_160;
  void *pvStack_158;
  fdb_iterator *pfStack_150;
  char acStack_144 [4];
  fdb_kvs_handle *pfStack_140;
  fdb_kvs_handle *pfStack_138;
  fdb_kvs_handle *pfStack_130;
  fdb_kvs_handle *pfStack_128;
  size_t sStack_120;
  timeval tStack_118;
  fdb_kvs_info fStack_108;
  fdb_kvs_handle *pfStack_d8;
  fdb_kvs_handle *pfStack_d0;
  fdb_doc *pfStack_a0;
  timeval tStack_98;
  ulong uStack_88;
  fdb_kvs_handle *pfStack_80;
  char *apcStack_78 [2];
  timeval tStack_68;
  storage_t *psStack_58;
  person_t *ppStack_50;
  fdb_doc *local_40;
  timeval local_38;
  
  handle = (char *)0x0;
  ppStack_50 = (person_t *)0x109740;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  pcVar12 = (char *)&local_40;
  local_40 = (fdb_doc *)0x0;
  ppStack_50 = (person_t *)0x109750;
  sVar7 = strlen(p->key);
  ppStack_50 = (person_t *)0x10976a;
  fdb_doc_create((fdb_doc **)pcVar12,p,sVar7,(void *)0x0,0,(void *)0x0,0);
  ppStack_50 = (person_t *)0x109776;
  fVar4 = fdb_get(st->all_docs,local_40);
  __s1 = (char *)(ulong)(uint)fVar4;
  pfVar13 = st->all_docs;
  ppStack_50 = (person_t *)0x109784;
  pfVar11 = local_40;
  fVar5 = fdb_del(pfVar13,local_40);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    handle = (char *)st->index1;
    pcVar12 = p->name;
    ppStack_50 = (person_t *)0x10979f;
    sVar7 = strlen(pcVar12);
    ppStack_50 = (person_t *)0x1097ad;
    pfVar11 = (fdb_doc *)pcVar12;
    pfVar13 = (fdb_kvs_handle *)handle;
    fVar5 = fdb_del_kv((fdb_kvs_handle *)handle,pcVar12,sVar7);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010983d;
    handle = (char *)st->index2;
    ppStack_50 = (person_t *)0x1097c1;
    sVar7 = strlen(pcVar12);
    ppStack_50 = (person_t *)0x1097cf;
    pfVar11 = (fdb_doc *)pcVar12;
    pfVar13 = (fdb_kvs_handle *)handle;
    fVar5 = fdb_del_kv((fdb_kvs_handle *)handle,pcVar12,sVar7);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      ppStack_50 = (person_t *)0x1097ec;
      save_tx(st,local_40->key,local_40->keylen,2);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        ppStack_50 = (person_t *)0x1097fc;
        bVar3 = is_indexed(st->index_params,p);
        if (bVar3) {
          pcVar8 = st->v_chk;
          piVar1 = &pcVar8->num_indexed;
          *piVar1 = *piVar1 + -1;
          piVar1 = &pcVar8->sum_age_indexed;
          *piVar1 = *piVar1 - p->age;
        }
        piVar1 = &st->v_chk->ndocs;
        *piVar1 = *piVar1 + -1;
      }
      ppStack_50 = (person_t *)0x10982b;
      fdb_doc_free(local_40);
      return;
    }
  }
  else {
    ppStack_50 = (person_t *)0x10983d;
    e2e_fdb_del_person_cold_1();
LAB_0010983d:
    ppStack_50 = (person_t *)0x109842;
    e2e_fdb_del_person_cold_2();
  }
  ppStack_50 = (person_t *)e2e_fdb_commit;
  e2e_fdb_del_person_cold_3();
  apcStack_78[0] = (char *)0x10985f;
  psStack_58 = st;
  ppStack_50 = p;
  gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
  apcStack_78[0] = (char *)0x109869;
  pfVar14 = pfVar13;
  fVar4 = fdb_commit((fdb_file_handle *)pfVar13,(fdb_commit_opt_t)pfVar11);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    return;
  }
  apcStack_78[0] = (char *)start_checkpoint;
  e2e_fdb_commit_cold_1();
  uStack_88 = (ulong)pfVar11 & 0xffffffff;
  pfStack_80 = pfVar13;
  apcStack_78[0] = pcVar12;
  gettimeofday(&tStack_98,(__timezone_ptr_t)0x0);
  pfStack_a0 = (fdb_doc *)0x0;
  pfVar13 = (fdb_kvs_handle *)pfVar14->op_stats;
  uVar10._0_1_ = '\x02';
  uVar10._1_1_ = '\0';
  uVar10._2_1_ = '\0';
  uVar10._3_1_ = '\0';
  fVar4 = fdb_begin_transaction((fdb_file_handle *)pfVar13,'\x02');
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pcVar8 = create_checkpoint((storage_t *)pfVar14,5);
    sVar7 = strlen(pcVar8->key);
    fdb_doc_create(&pfStack_a0,pcVar8,sVar7,(void *)0x0,0,pcVar8,0x430);
    save_tx((storage_t *)pfVar14,pfStack_a0->key,pfStack_a0->keylen,5);
    pfVar13 = (fdb_kvs_handle *)pfVar14->trie;
    pfVar11 = pfStack_a0;
    fVar4 = fdb_set(pfVar13,pfStack_a0);
    uVar10 = SUB84(pfVar11,0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      free(pcVar8);
      fdb_doc_free(pfStack_a0);
      return;
    }
  }
  else {
    start_checkpoint_cold_1();
  }
  start_checkpoint_cold_2();
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x10995b;
  acStack_144 = (char  [4])uVar10;
  pfStack_d8 = pfVar14;
  pfStack_d0 = (fdb_kvs_handle *)handle;
  gettimeofday(&tStack_118,(__timezone_ptr_t)0x0);
  psStack_160 = (snap_handle *)0x0;
  __s2._M_i = (__int_type)(pfVar13->field_6).seqtree;
  pvStack_158 = (void *)0x0;
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109973;
  __s._M_i = (__int_type)malloc(0x430);
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109985;
  memset((void *)__s._M_i,0,0x430);
  pfVar14 = (fdb_kvs_handle *)pfVar13->trie;
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109993;
  fVar4 = fdb_get_kvs_info(pfVar14,&fStack_108);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_128 = (fdb_kvs_handle *)(__s2._M_i + 0xc);
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099b1;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar13->kvs_config,*(bool *)((long)&pfVar13->file + 6));
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099c0;
    fVar9 = last_snap_seqnum((storage_t *)pfVar13,"e2ekv_alldocs");
    *(fdb_seqnum_t *)(__s._M_i + 0x410) = fVar9;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099d6;
    fVar9 = last_snap_seqnum((storage_t *)pfVar13,"e2ekv_index1");
    *(fdb_seqnum_t *)(__s._M_i + 0x418) = fVar9;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099ec;
    fVar9 = last_snap_seqnum((storage_t *)pfVar13,"e2ekv_index2");
    *(fdb_seqnum_t *)(__s._M_i + 0x420) = fVar9;
    lVar15 = 0;
    __s1 = (char *)0x8421084210842109;
    handle = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    do {
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a0c;
      iVar6 = rand();
      *(char *)(__s._M_i + lVar15) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar6 % 0x3e];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0xc);
    *(undefined1 *)(__s._M_i + 0xb) = 0;
    *(undefined4 *)(__s._M_i + 0x400) = (undefined4)fStack_108.doc_count;
    *(undefined2 *)(__s._M_i + 0x40c) = 0;
    *(short *)(__s._M_i + 0x428) = acStack_144._0_2_;
    pfVar14 = (fdb_kvs_handle *)(pfVar13->kvs_config).custom_cmp;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a74;
    fVar4 = fdb_snapshot_open(pfVar14,&pfStack_140,*(fdb_seqnum_t *)(__s._M_i + 0x410));
    unaff_R13 = (snap_handle **)0xc;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00109c41;
    pfVar14 = (fdb_kvs_handle *)(pfVar13->kvs_config).custom_cmp_param;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a91;
    fVar4 = fdb_snapshot_open(pfVar14,&pfStack_130,*(fdb_seqnum_t *)(__s._M_i + 0x418));
    handle = (char *)pfStack_128;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00109c46;
    pfVar14 = (fdb_kvs_handle *)pfVar13->kvs;
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ab3;
    fVar4 = fdb_snapshot_open(pfVar14,&pfStack_138,*(fdb_seqnum_t *)(__s._M_i + 0x420));
    if (fVar4 == FDB_RESULT_SUCCESS) {
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ae2;
      fVar4 = fdb_iterator_init(pfStack_130,&pfStack_150,(void *)__s2._M_i,0xc,handle,0xc,2);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfVar13 = (fdb_kvs_handle *)&pfVar13->file;
        unaff_R13 = &psStack_160;
        do {
          aStack_178.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109b4c;
          fVar4 = fdb_iterator_get(pfStack_150,(fdb_doc **)unaff_R13);
          if (fVar4 == FDB_RESULT_SUCCESS) {
            __s1 = (char *)psStack_160->snap_tag_idx;
            aStack_178.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109b68;
            iVar6 = strcmp(__s1,(char *)__s2._M_i);
            if (iVar6 < 0) {
LAB_00109c29:
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c37;
              create_checkpoint_cold_5();
            }
            else {
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109b7b;
              iVar6 = strcmp(__s1,handle);
              if (0 < iVar6) goto LAB_00109c29;
            }
            aStack_178.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109ba4;
            fVar4 = fdb_get_kv(pfStack_140,(void *)psStack_160->seqnum,
                               (size_t)(psStack_160->avl_id).right,&pvStack_158,&sStack_120);
            if (fVar4 == FDB_RESULT_SUCCESS) {
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109bbd;
              iVar6 = strcmp((char *)((long)pvStack_158 + 0xe00),(char *)pfVar13);
              if (iVar6 == 0) {
                *(int *)(__s._M_i + 0x404) = *(int *)(__s._M_i + 0x404) + 1;
                aStack_178.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)0x109bd6;
                pfVar14 = pfStack_138;
                fVar4 = fdb_get(pfStack_138,(fdb_doc *)psStack_160);
                if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00109c50;
                *(int *)(__s._M_i + 0x408) =
                     *(int *)(__s._M_i + 0x408) + *(int *)psStack_160->seqnum;
              }
              aStack_178.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109bf5;
              free(pvStack_158);
              pvStack_158 = (void *)0x0;
            }
            aStack_178.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109c08;
            fdb_doc_free((fdb_doc *)psStack_160);
            psStack_160 = (snap_handle *)0x0;
          }
          aStack_178.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109c1b;
          fVar4 = fdb_iterator_next(pfStack_150);
        } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
      }
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109af0;
      fdb_doc_free((fdb_doc *)psStack_160);
      psStack_160 = (snap_handle *)0x0;
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b03;
      fdb_iterator_close(pfStack_150);
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b0d;
      fdb_kvs_close(pfStack_140);
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b17;
      fdb_kvs_close(pfStack_130);
      aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b21;
      fdb_kvs_close(pfStack_138);
      return;
    }
  }
  else {
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c41;
    create_checkpoint_cold_1();
LAB_00109c41:
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c46;
    create_checkpoint_cold_2();
LAB_00109c46:
    aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c4b;
    create_checkpoint_cold_3();
  }
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c50;
  create_checkpoint_cold_4();
LAB_00109c50:
  aStack_178.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)end_checkpoint;
  create_checkpoint_cold_6();
  pcStack_1b0 = (checkpoint_t *)0x109c6d;
  aStack_188.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s._M_i;
  pfStack_180 = pfVar13;
  aStack_178.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s2._M_i;
  gettimeofday((timeval *)(auStack_1a0 + 8),(__timezone_ptr_t)0x0);
  doc_00 = (list *)auStack_1a0;
  auStack_1a0._0_8_ = (fdb_doc *)0x0;
  pcStack_1b0 = (checkpoint_t *)0x109c86;
  pcVar8 = create_checkpoint((storage_t *)pfVar14,6);
  pcStack_1b0 = (checkpoint_t *)0x109c91;
  sVar7 = strlen(pcVar8->key);
  pcStack_1b0 = (checkpoint_t *)0x109caf;
  fdb_doc_create((fdb_doc **)doc_00,pcVar8,sVar7,(void *)0x0,0,pcVar8,0x430);
  pcStack_1b0 = (checkpoint_t *)0x109cc6;
  save_tx((storage_t *)pfVar14,*(void **)(auStack_1a0._0_8_ + 0x20),*(size_t *)auStack_1a0._0_8_,6);
  pfVar13 = (fdb_kvs_handle *)pfVar14->op_stats;
  pcStack_1b0 = (checkpoint_t *)0x109cd3;
  fVar4 = fdb_end_transaction((fdb_file_handle *)pfVar13,
                              *(fdb_commit_opt_t *)((long)&pfVar14->file + 6));
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar13 = (fdb_kvs_handle *)pfVar14->trie;
    pcStack_1b0 = (checkpoint_t *)0x109ce5;
    fVar4 = fdb_set(pfVar13,(fdb_doc *)auStack_1a0._0_8_);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pcStack_1b0 = (checkpoint_t *)0x109cf1;
      free(pcVar8);
      pcStack_1b0 = (checkpoint_t *)0x109cfb;
      fdb_doc_free((fdb_doc *)auStack_1a0._0_8_);
      return;
    }
  }
  else {
    pcStack_1b0 = (checkpoint_t *)0x109d0a;
    end_checkpoint_cold_1();
  }
  pcStack_1b0 = (checkpoint_t *)e2e_fdb_cancel_checkpoint;
  end_checkpoint_cold_2();
  plStack_318 = (list *)0x109d28;
  pfStack_1b8 = pfVar14;
  pcStack_1b0 = pcVar8;
  gettimeofday(&tStack_300,(__timezone_ptr_t)0x0);
  pfStack_308 = (fdb_doc *)0x0;
  pfVar14 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)&pfVar13->trie)->super___atomic_base<unsigned_long>)._M_i;
  handle_in = (checkpoint_t *)auStack_2f0;
  plStack_318 = (list *)0x109d3f;
  fVar4 = fdb_get_kvs_info(pfVar14,(fdb_kvs_info *)handle_in);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar14 = (fdb_kvs_handle *)&pfStack_308;
    handle_in = (checkpoint_t *)0x0;
    plStack_318 = (list *)0x109d65;
    fVar4 = fdb_doc_create((fdb_doc **)pfVar14,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00109e64;
    pfStack_308->seqnum = auStack_2f0._8_8_;
    plStack_318 = (list *)0x109d84;
    fdb_get_byseq((fdb_kvs_handle *)
                  (((atomic<unsigned_long> *)&pfVar13->trie)->super___atomic_base<unsigned_long>).
                  _M_i,pfStack_308);
    pcVar8 = (checkpoint_t *)pfStack_308->body;
    if (pcVar8->type != 5) {
      plStack_318 = (list *)0x109da4;
      e2e_fdb_cancel_checkpoint_cold_3();
    }
    pfVar14 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp;
    handle_in = (checkpoint_t *)pcVar8->seqnum_all;
    plStack_318 = (list *)0x109db4;
    fVar4 = fdb_rollback((fdb_kvs_handle **)pfVar14,(fdb_seqnum_t)handle_in);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00109e69;
    pfVar14 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp_param;
    handle_in = (checkpoint_t *)pcVar8->seqnum_idx1;
    plStack_318 = (list *)0x109dcc;
    fVar4 = fdb_rollback((fdb_kvs_handle **)pfVar14,(fdb_seqnum_t)handle_in);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00109e6e;
    pfVar14 = (fdb_kvs_handle *)&pfVar13->kvs;
    handle_in = (checkpoint_t *)pcVar8->seqnum_idx2;
    plStack_318 = (list *)0x109de4;
    fVar4 = fdb_rollback((fdb_kvs_handle **)pfVar14,(fdb_seqnum_t)handle_in);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00109e73;
    plStack_318 = (list *)0x109dfd;
    handle_in = pcVar8;
    memcpy(pfVar13->staletree,pcVar8,0x430);
    pfVar14 = (fdb_kvs_handle *)
              (((atomic<unsigned_long> *)&pfVar13->op_stats)->super___atomic_base<unsigned_long>).
              _M_i;
    plStack_318 = (list *)0x109e06;
    fVar4 = fdb_abort_transaction((fdb_file_handle *)pfVar14);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      plStack_318 = (list *)0x109e27;
      sprintf(auStack_2f0 + 0x30,"revert to checkpoint[seqno:%lu]\n",pcVar8->seqnum_all);
      pcVar12 = "%s PASSED\n";
      if (e2e_fdb_cancel_checkpoint::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      plStack_318 = (list *)0x109e54;
      fprintf(_stderr,pcVar12,auStack_2f0 + 0x30);
      return;
    }
  }
  else {
    plStack_318 = (list *)0x109e64;
    e2e_fdb_cancel_checkpoint_cold_1();
LAB_00109e64:
    plStack_318 = (list *)0x109e69;
    e2e_fdb_cancel_checkpoint_cold_2();
LAB_00109e69:
    plStack_318 = (list *)0x109e6e;
    e2e_fdb_cancel_checkpoint_cold_4();
LAB_00109e6e:
    plStack_318 = (list *)0x109e73;
    e2e_fdb_cancel_checkpoint_cold_5();
LAB_00109e73:
    plStack_318 = (list *)0x109e78;
    e2e_fdb_cancel_checkpoint_cold_6();
  }
  plStack_318 = (list *)scan;
  e2e_fdb_cancel_checkpoint_cold_7();
  pcStackY_380 = (code *)0x109e9a;
  pfStack_330 = pfVar13;
  pfStack_328 = (fdb_kvs_handle *)handle;
  pcStack_320 = pcVar8;
  plStack_318 = doc_00;
  gettimeofday(&tStack_340,(__timezone_ptr_t)0x0);
  pfStack_370 = (fdb_doc *)0x0;
  pcStackY_380 = (code *)0x109ead;
  gen_index_params(&iStack_358);
  if (handle_in != (checkpoint_t *)0x0) {
    pcStackY_380 = (code *)0x109ec6;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)handle_in,&pfStack_360,0xffffffffffffffff);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00109eec;
    pcStackY_380 = (code *)0x109ecf;
    scan_cold_1();
  }
  pfVar13 = (fdb_kvs_handle *)(pfVar14->kvs_config).custom_cmp_param;
  ptr_handle = &pfStack_360;
  pcStackY_380 = (code *)0x109ee4;
  fVar4 = fdb_snapshot_open(pfVar13,ptr_handle,0xffffffffffffffff);
  if (fVar4 == FDB_RESULT_SUCCESS) {
LAB_00109eec:
    pcStackY_380 = (code *)0x109f1a;
    fVar4 = fdb_iterator_init(pfStack_360,&pfStack_368,&iStack_358,0xc,iStack_358.max,0xc,0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      do {
        pcStackY_380 = (code *)0x109f50;
        fVar4 = fdb_iterator_get(pfStack_368,&pfStack_370);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          pcVar12 = (char *)pfStack_370->key;
          pcStackY_380 = (code *)0x109f68;
          iVar6 = strcmp(pcVar12,iStack_358.min);
          if (iVar6 < 0) {
LAB_00109fa2:
            pcStackY_380 = (code *)0x109fb0;
            scan_cold_3();
          }
          else {
            pcStackY_380 = (code *)0x109f77;
            iVar6 = strcmp(pcVar12,iStack_358.max);
            if (0 < iVar6) goto LAB_00109fa2;
          }
          pcStackY_380 = (code *)0x109f85;
          fdb_doc_free(pfStack_370);
          pfStack_370 = (fdb_doc *)0x0;
        }
        pcStackY_380 = (code *)0x109f98;
        fVar4 = fdb_iterator_next(pfStack_368);
      } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    }
    pcStackY_380 = (code *)0x109f28;
    fdb_iterator_close(pfStack_368);
    return;
  }
  pcStackY_380 = last_snap_seqnum;
  scan_cold_2();
  plStackY_3e8 = (list *)0x109fd7;
  pcStackY_3a8 = handle_in;
  pfStackY_3a0 = (fdb_kvs_handle *)handle;
  ppsStackY_398 = unaff_R13;
  pfStackY_390 = pfVar14;
  plStackY_388 = doc_00;
  pcStackY_380 = (code *)__s1;
  gettimeofday(&tStackY_3b8,(__timezone_ptr_t)0x0);
  fhandle = *(fdb_file_handle **)&pfVar13->kvs_config;
  ppfVar16 = &pfStackY_3d0;
  plStackY_3e8 = (list *)0x109fe9;
  fVar4 = fdb_get_all_snap_markers
                    (fhandle,(fdb_snapshot_info_t **)ppfVar16,(uint64_t *)&ppfStackY_3c0);
  pfVar2 = pfStackY_3d0;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    ppfStackY_3d8 = ppfStackY_3c0;
    if (ppfStackY_3c0 == (fdb_file_handle **)0x0) {
      bVar3 = false;
    }
    else {
      ppfVar16 = (fdb_file_handle **)0x0;
      bVar3 = false;
      do {
        doc_00 = (&pfVar2->handles)[(long)ppfVar16 * 3];
        if (0 < (long)doc_00) {
          pfVar13 = (fdb_kvs_handle *)&(&pfVar2->cmp_func_list)[(long)ppfVar16 * 3]->tail;
          do {
            plStackY_3e8 = (list *)0x10a037;
            iVar6 = strcmp((char *)pfVar13[-1].bub_ctx.handle,(char *)ptr_handle);
            if (iVar6 == 0) {
              uStackY_3c8 = *(undefined8 *)&pfVar13->kvs_config;
              bVar3 = true;
              break;
            }
            pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp_param;
            doc_00 = (list *)((long)&doc_00[-1].tail + 7);
          } while (doc_00 != (list *)0x0);
        }
      } while ((!bVar3) &&
              (ppfVar16 = (fdb_file_handle **)((long)ppfVar16 + 1), ppfVar16 != ppfStackY_3d8));
    }
    plStackY_3e8 = (list *)0x10a074;
    ppfVar16 = ppfStackY_3d8;
    fVar4 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStackY_3d0,(uint64_t)ppfStackY_3d8);
    fhandle = pfStackY_3d0;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      if (bVar3) {
        return;
      }
      goto LAB_0010a09c;
    }
  }
  else {
    plStackY_3e8 = (list *)0x10a097;
    last_snap_seqnum();
  }
  plStackY_3e8 = (list *)0x10a09c;
  last_snap_seqnum();
LAB_0010a09c:
  plStackY_3e8 = (list *)print_n_markers;
  last_snap_seqnum();
  ppfStackY_3f8 = ptr_handle;
  pfStackY_3f0 = pfVar13;
  plStackY_3e8 = doc_00;
  fdb_get_all_snap_markers((fdb_file_handle *)fhandle->root,&pfStackY_408,&uStackY_400);
  if (ppfVar16 != (fdb_file_handle **)0x0) {
    lVar15 = 0x10;
    do {
      printf("marker:  %lu\n",*(undefined8 *)(*(long *)((long)&pfStackY_408->marker + lVar15) + 8));
      lVar15 = lVar15 + 0x18;
      ppfVar16 = (fdb_file_handle **)((long)ppfVar16 + -1);
    } while (ppfVar16 != (fdb_file_handle **)0x0);
  }
  return;
}

Assistant:

void e2e_fdb_del_person(storage_t *st, person_t *p){
    TEST_INIT();

    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    fdb_doc_create(&doc, p->key, strlen(p->key), NULL, 0, NULL, 0);

    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_del(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_del_kv(st->index1, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_del_kv(st->index2, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, DEL_PERSON);

    if(existed){ // check if was indexed
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed--;
            st->v_chk->sum_age_indexed-=p->age;
        }
        st->v_chk->ndocs -= 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}